

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::reset_srv_to_join(raft_server *this)

{
  int __how;
  peer *pp;
  
  pp = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  clear_snapshot_sync_ctx(this,pp);
  peer::shutdown((this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(int)pp,__how);
  std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void raft_server::reset_srv_to_join() {
    clear_snapshot_sync_ctx(*srv_to_join_);
    srv_to_join_->shutdown();
    srv_to_join_.reset();
}